

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

QSize __thiscall QWatermarkLabel::minimumSizeHint(QWatermarkLabel *this)

{
  bool bVar1;
  char cVar2;
  QSize QVar3;
  long in_FS_OFFSET;
  double dVar4;
  undefined1 auVar5 [16];
  QPixmap aQStack_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QLabel::pixmap((QLabel *)aQStack_38);
  cVar2 = QPixmap::isNull();
  QPixmap::~QPixmap(aQStack_38);
  if (cVar2 == '\0') {
    QLabel::pixmap((QLabel *)aQStack_38);
    auVar5 = QPixmap::deviceIndependentSize();
    dVar4 = (double)((ulong)auVar5._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._0_8_;
    bVar1 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    QVar3.wd.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4)
    ;
    dVar4 = (double)((ulong)auVar5._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._8_8_;
    bVar1 = 2147483647.0 < dVar4;
    if (dVar4 <= -2147483648.0) {
      dVar4 = -2147483648.0;
    }
    QVar3.ht.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4)
    ;
    QPixmap::~QPixmap(aQStack_38);
  }
  else {
    QVar3 = QWidget::minimumSizeHint((QWidget *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize minimumSizeHint() const override {
        if (!pixmap().isNull())
            return pixmap().deviceIndependentSize().toSize();
        return QFrame::minimumSizeHint();
    }